

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode)

{
  Type TVar1;
  Type expected2;
  Result RVar2;
  char *desc;
  Opcode local_24;
  
  TVar1 = Opcode::GetParamType1(&local_24);
  expected2 = Opcode::GetParamType2(&local_24);
  desc = Opcode::GetName(&local_24);
  RVar2 = PopAndCheck2Types(this,TVar1,expected2,desc);
  TVar1 = Opcode::GetResultType(&local_24);
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode) {
  Result result = PopAndCheck2Types(opcode.GetParamType1(),
                                    opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}